

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void gai_FindOffset(Integer ndim,Integer *lo,Integer *plo,Integer *ld,Integer *offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  *offset = 0;
  if (0 < ndim) {
    lVar1 = 1;
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar2 = (plo[lVar3] - lo[lVar3]) * lVar1 + lVar2;
      *offset = lVar2;
      if (lVar3 < ndim + -1) {
        lVar1 = lVar1 * ld[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (ndim != lVar3);
  }
  return;
}

Assistant:

void  gai_FindOffset(Integer ndim,Integer *lo, Integer *plo,
    Integer *ld, Integer *offset)
{
  Integer i, factor;
  *offset = 0;
  factor = 1;
  for (i=0; i<ndim; i++) {
    *offset += (plo[i]-lo[i])*factor; 
    if (i<ndim-1) factor *= ld[i];
  }
}